

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetCurrentWindow(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  float fVar2;
  ImGuiTable *local_20;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  GImGui->CurrentWindow = window;
  if ((window == (ImGuiWindow *)0x0) || ((window->DC).CurrentTableIdx == -1)) {
    local_20 = (ImGuiTable *)0x0;
  }
  else {
    local_20 = ImPool<ImGuiTable>::GetByIndex(&pIVar1->Tables,(window->DC).CurrentTableIdx);
  }
  pIVar1->CurrentTable = local_20;
  if (window != (ImGuiWindow *)0x0) {
    fVar2 = ImGuiWindow::CalcFontSize(window);
    (pIVar1->DrawListSharedData).FontSize = fVar2;
    pIVar1->FontSize = fVar2;
  }
  return;
}

Assistant:

static void SetCurrentWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow = window;
    g.CurrentTable = window && window->DC.CurrentTableIdx != -1 ? g.Tables.GetByIndex(window->DC.CurrentTableIdx) : NULL;
    if (window)
        g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
}